

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

lytype_plugin_list * lytype_find(char *module,char *revision,char *type_name)

{
  char *s2;
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    if (type_plugins_count <= uVar2) {
      return (lytype_plugin_list *)0x0;
    }
    iVar1 = ly_strequal_(module,*(char **)((long)&type_plugins->module + lVar3));
    if (iVar1 != 0) {
      s2 = *(char **)((long)&type_plugins->revision + lVar3);
      if (revision == (char *)0x0) {
        if (s2 == (char *)0x0) goto LAB_0016b11e;
      }
      else {
        iVar1 = ly_strequal_(revision,s2);
        if (iVar1 != 0) {
LAB_0016b11e:
          iVar1 = ly_strequal_(type_name,*(char **)((long)&type_plugins->name + lVar3));
          if (iVar1 != 0) {
            return (lytype_plugin_list *)((long)&type_plugins->module + lVar3);
          }
        }
      }
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x28;
  } while( true );
}

Assistant:

static struct lytype_plugin_list *
lytype_find(const char *module, const char *revision, const char *type_name)
{
    uint16_t u;

    for (u = 0; u < type_plugins_count; ++u) {
        if (ly_strequal(module, type_plugins[u].module, 0) && ((!revision && !type_plugins[u].revision)
                || (revision && ly_strequal(revision, type_plugins[u].revision, 0)))
                && ly_strequal(type_name, type_plugins[u].name, 0)) {
            return &(type_plugins[u]);
        }
    }

    return NULL;
}